

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

void lys_switch_deviations(lys_module *module)

{
  lys_deviation *plVar1;
  char *__needle;
  lys_module *module_00;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  uint32_t local_34 [2];
  uint32_t i;
  
  local_34[0] = 0;
  if ((module->field_0x40 & 0x30) != 0) {
    module_00 = ly_ctx_get_module_iter(module->ctx,local_34);
    while (module_00 != (lys_module *)0x0) {
      if ((module_00 != module) && (module_00->deviation_size != '\0')) {
        lVar4 = 0;
        uVar5 = 0;
        do {
          plVar1 = module_00->deviation;
          __needle = module->name;
          pcVar2 = strstr(*(char **)((long)&plVar1->target_name + lVar4),__needle);
          if ((pcVar2 != (char *)0x0) && (sVar3 = strlen(__needle), pcVar2[sVar3] == ':')) {
            lys_switch_deviation((lys_deviation *)((long)&plVar1->target_name + lVar4),module_00);
          }
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x38;
        } while (uVar5 < module_00->deviation_size);
      }
      module_00 = ly_ctx_get_module_iter(module->ctx,local_34);
    }
    module->field_0x40 =
         (((module->field_0x40 & 0x30) != 0x20) << 4 | module->field_0x40 & 0xcf) + 0x10;
  }
  return;
}

Assistant:

void
lys_switch_deviations(struct lys_module *module)
{
    uint32_t i = 0, j;
    const struct lys_module *mod;
    const char *ptr;

    if (module->deviated) {
        while ((mod = ly_ctx_get_module_iter(module->ctx, &i))) {
            if (mod == module) {
                continue;
            }

            for (j = 0; j < mod->deviation_size; ++j) {
                ptr = strstr(mod->deviation[j].target_name, module->name);
                if (ptr && ptr[strlen(module->name)] == ':') {
                    lys_switch_deviation(&mod->deviation[j], mod);
                }
            }
        }

        if (module->deviated == 2) {
            module->deviated = 1;
        } else {
            module->deviated = 2;
        }
    }
}